

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tv_ctrlpt.c
# Opt level: O0

int TvCtrlPointPrintDevice(int devnum)

{
  undefined8 in_stack_ffffffffffffff68;
  undefined4 uVar1;
  char local_53 [8];
  char spacer [15];
  int var;
  int service;
  int i;
  TvDeviceNode *tmpdevnode;
  int devnum_local;
  
  uVar1 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  var = 0;
  if (devnum < 1) {
    SampleUtil_Print("Error in TvCtrlPointPrintDevice: invalid devnum = %d\n",(ulong)(uint)devnum);
    tmpdevnode._4_4_ = -1;
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)&DeviceListMutex);
    SampleUtil_Print("TvCtrlPointPrintDevice:\n");
    _service = GlobalDeviceList;
    while ((_service != (TvDeviceNode *)0x0 && (var = var + 1, var != devnum))) {
      _service = _service->next;
    }
    if (_service == (TvDeviceNode *)0x0) {
      SampleUtil_Print("Error in TvCtrlPointPrintDevice: invalid devnum = %d  --  actual device count = %d\n"
                       ,(ulong)(uint)devnum,(ulong)(uint)var);
    }
    else {
      SampleUtil_Print("  TvDevice -- %d\n    |                  \n    +- UDN        = %s\n    +- DescDocURL     = %s\n    +- FriendlyName   = %s\n    +- PresURL        = %s\n    +- Adver. TimeOut = %d\n"
                       ,(ulong)(uint)devnum,_service,(_service->device).DescDocURL,
                       (_service->device).FriendlyName,(_service->device).PresURL,
                       CONCAT44(uVar1,(_service->device).AdvrTimeOut));
      spacer[0xb] = '\0';
      spacer[0xc] = '\0';
      spacer[0xd] = '\0';
      spacer[0xe] = '\0';
      for (; (int)spacer._11_4_ < 2; spacer._11_4_ = spacer._11_4_ + 1) {
        if ((int)spacer._11_4_ < 1) {
          sprintf(local_53,"    |    ");
        }
        else {
          sprintf(local_53,"         ");
        }
        SampleUtil_Print("    |                  \n    +- Tv %s Service\n%s+- ServiceId       = %s\n%s+- ServiceType     = %s\n%s+- EventURL        = %s\n%s+- ControlURL      = %s\n%s+- SID             = %s\n%s+- ServiceStateTable\n"
                         ,TvServiceName[(int)spacer._11_4_],local_53,
                         (_service->device).TvService + (int)spacer._11_4_,local_53,
                         (_service->device).TvService[(int)spacer._11_4_].ServiceType,local_53,
                         (_service->device).TvService[(int)spacer._11_4_].EventURL,local_53,
                         (_service->device).TvService[(int)spacer._11_4_].ControlURL,local_53,
                         (_service->device).TvService[(int)spacer._11_4_].SID,local_53);
        spacer[7] = '\0';
        spacer[8] = '\0';
        spacer[9] = '\0';
        spacer[10] = '\0';
        for (; (int)spacer._7_4_ < (int)TvVarCount[(int)spacer._11_4_];
            spacer._7_4_ = spacer._7_4_ + 1) {
          SampleUtil_Print("%s     +- %-10s = %s\n",local_53,
                           TvVarName[(int)spacer._11_4_][(int)spacer._7_4_],
                           (_service->device).TvService[(int)spacer._11_4_].VariableStrVal
                           [(int)spacer._7_4_]);
        }
      }
    }
    SampleUtil_Print("\n");
    pthread_mutex_unlock((pthread_mutex_t *)&DeviceListMutex);
    tmpdevnode._4_4_ = 0;
  }
  return tmpdevnode._4_4_;
}

Assistant:

int TvCtrlPointPrintDevice(int devnum)
{
	struct TvDeviceNode *tmpdevnode;
	int i = 0, service, var;
	char spacer[15];

	if (devnum <= 0) {
		SampleUtil_Print("Error in TvCtrlPointPrintDevice: "
				 "invalid devnum = %d\n",
			devnum);
		return TV_ERROR;
	}

	ithread_mutex_lock(&DeviceListMutex);

	SampleUtil_Print("TvCtrlPointPrintDevice:\n");
	tmpdevnode = GlobalDeviceList;
	while (tmpdevnode) {
		i++;
		if (i == devnum)
			break;
		tmpdevnode = tmpdevnode->next;
	}
	if (!tmpdevnode) {
		SampleUtil_Print(
			"Error in TvCtrlPointPrintDevice: "
			"invalid devnum = %d  --  actual device count = %d\n",
			devnum,
			i);
	} else {
		SampleUtil_Print("  TvDevice -- %d\n"
				 "    |                  \n"
				 "    +- UDN        = %s\n"
				 "    +- DescDocURL     = %s\n"
				 "    +- FriendlyName   = %s\n"
				 "    +- PresURL        = %s\n"
				 "    +- Adver. TimeOut = %d\n",
			devnum,
			tmpdevnode->device.UDN,
			tmpdevnode->device.DescDocURL,
			tmpdevnode->device.FriendlyName,
			tmpdevnode->device.PresURL,
			tmpdevnode->device.AdvrTimeOut);
		for (service = 0; service < TV_SERVICE_SERVCOUNT; service++) {
			if (service < TV_SERVICE_SERVCOUNT - 1)
				sprintf(spacer, "    |    ");
			else
				sprintf(spacer, "         ");
			SampleUtil_Print("    |                  \n"
					 "    +- Tv %s Service\n"
					 "%s+- ServiceId       = %s\n"
					 "%s+- ServiceType     = %s\n"
					 "%s+- EventURL        = %s\n"
					 "%s+- ControlURL      = %s\n"
					 "%s+- SID             = %s\n"
					 "%s+- ServiceStateTable\n",
				TvServiceName[service],
				spacer,
				tmpdevnode->device.TvService[service].ServiceId,
				spacer,
				tmpdevnode->device.TvService[service]
					.ServiceType,
				spacer,
				tmpdevnode->device.TvService[service].EventURL,
				spacer,
				tmpdevnode->device.TvService[service]
					.ControlURL,
				spacer,
				tmpdevnode->device.TvService[service].SID,
				spacer);
			for (var = 0; var < TvVarCount[service]; var++) {
				SampleUtil_Print("%s     +- %-10s = %s\n",
					spacer,
					TvVarName[service][var],
					tmpdevnode->device.TvService[service]
						.VariableStrVal[var]);
			}
		}
	}
	SampleUtil_Print("\n");
	ithread_mutex_unlock(&DeviceListMutex);

	return TV_SUCCESS;
}